

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_test.cpp
# Opt level: O1

void __thiscall
Properties_MingapAfterTransformations_Test::TestBody
          (Properties_MingapAfterTransformations_Test *this)

{
  char *message;
  AssertionResult gtest_ar;
  Manifold b;
  Manifold a;
  undefined4 uVar1;
  undefined4 uVar2;
  double in_stack_ffffffffffffff70;
  Manifold in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff88;
  AssertHelper local_68 [2];
  Manifold local_58 [16];
  Manifold local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 uStack_10;
  
  manifold::Manifold::Sphere(1.0,(int)local_58);
  manifold::Manifold::Rotate(30.0,30.0,30.0);
  manifold::Manifold::~Manifold(local_58);
  manifold::Manifold::Sphere(1.0,(int)local_68);
  local_38 = 0x4008000000000000;
  uStack_30 = 0x3ff0000000000000;
  local_28 = 0x3ff0000000000000;
  manifold::Manifold::Scale(&stack0xffffffffffffff88,local_68);
  manifold::Manifold::Rotate(0.0,90.0,45.0);
  local_20 = 0x4008000000000000;
  uStack_18 = 0;
  uStack_10 = 0;
  local_20._0_4_ = 0;
  local_20._4_4_ = 0x40080000;
  uVar1 = (undefined4)local_20;
  uVar2 = local_20._4_4_;
  manifold::Manifold::Translate(local_58,&stack0xffffffffffffff78);
  manifold::Manifold::~Manifold((Manifold *)&stack0xffffffffffffff78);
  manifold::Manifold::~Manifold((Manifold *)&stack0xffffffffffffff88);
  manifold::Manifold::~Manifold((Manifold *)local_68);
  manifold::Manifold::MinGap(local_48,1.1);
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(uVar2,uVar1),(char *)0x13a32c,
             (char *)in_stack_ffffffffffffff88._M_head_impl,(double)in_stack_ffffffffffffff80,
             (double)CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  if (in_stack_ffffffffffffff78 == (Manifold)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffff88);
    if (in_stack_ffffffffffffff80 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (in_stack_ffffffffffffff80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/properties_test.cpp"
               ,0xca,message);
    testing::internal::AssertHelper::operator=(local_68,(Message *)&stack0xffffffffffffff88);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )in_stack_ffffffffffffff88._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff88._M_head_impl + 8))();
    }
  }
  if (in_stack_ffffffffffffff80 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffff80,in_stack_ffffffffffffff80);
  }
  manifold::Manifold::~Manifold(local_58);
  manifold::Manifold::~Manifold(local_48);
  return;
}

Assistant:

TEST(Properties, MingapAfterTransformations) {
  auto a = Manifold::Sphere(1, 512).Rotate(30, 30, 30);
  auto b =
      Manifold::Sphere(1, 512).Scale({3, 1, 1}).Rotate(0, 90, 45).Translate(
          {3, 0, 0});

  float distance = a.MinGap(b, 1.1);

  ASSERT_NEAR(distance, 1, 0.001);
}